

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::builtins::AssertControlTask::bindArgument
          (AssertControlTask *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax,
          Args *args)

{
  ExpressionSyntax *syntax_00;
  bool bVar1;
  Expression *pEVar2;
  Compilation *this_00;
  Compilation *compilation;
  bitmask<slang::ast::LookupFlags> extraLookupFlags;
  bitmask<slang::ast::LookupFlags> local_3c;
  Args *local_38;
  Args *args_local;
  ExpressionSyntax *syntax_local;
  ASTContext *context_local;
  size_t argIndex_local;
  AssertControlTask *this_local;
  
  local_38 = args;
  args_local = (Args *)syntax;
  syntax_local = (ExpressionSyntax *)context;
  context_local = (ASTContext *)argIndex;
  argIndex_local = (size_t)this;
  if (((((this->super_SystemTaskBase).super_SystemSubroutine.field_0x34 & 1) == 0) || (3 < argIndex)
      ) && ((((this->super_SystemTaskBase).super_SystemSubroutine.field_0x34 & 1) != 0 ||
            (argIndex != 0)))) {
    bVar1 = slang::syntax::NameSyntax::isKind((syntax->super_SyntaxNode).kind);
    extraLookupFlags.m_bits = (underlying_type)args;
    if (bVar1) {
      this_00 = ASTContext::getCompilation((ASTContext *)syntax_local);
      compilation = (Compilation *)
                    slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>
                              ((SyntaxNode *)args_local);
      syntax_00 = syntax_local;
      memset(&local_3c,0,4);
      bitmask<slang::ast::LookupFlags>::bitmask(&local_3c);
      pEVar2 = HierarchicalReferenceExpression::fromSyntax
                         ((HierarchicalReferenceExpression *)this_00,compilation,
                          (NameSyntax *)syntax_00,(ASTContext *)(ulong)local_3c.m_bits,
                          extraLookupFlags);
      return pEVar2;
    }
  }
  pEVar2 = SystemSubroutine::bindArgument
                     ((SystemSubroutine *)this,(size_t)context_local,(ASTContext *)syntax_local,
                      (ExpressionSyntax *)args_local,local_38);
  return pEVar2;
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args& args) const final {
        if ((isFullMethod && argIndex < 4) || (!isFullMethod && argIndex == 0) ||
            !NameSyntax::isKind(syntax.kind)) {
            return SystemTaskBase::bindArgument(argIndex, context, syntax, args);
        }

        return HierarchicalReferenceExpression::fromSyntax(context.getCompilation(),
                                                           syntax.as<NameSyntax>(), context);
    }